

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

FT_Error ps_parser_load_field
                   (PS_Parser parser,T1_Field field,void **objects,FT_UInt max_objects,
                   FT_ULong *pflags)

{
  byte bVar1;
  FT_Byte FVar2;
  FT_Byte *pFVar3;
  FT_Byte *pFVar4;
  void *pvVar5;
  FT_Fixed *pFVar6;
  bool bVar7;
  PS_Parser pPVar8;
  T1_Field pTVar9;
  uint uVar10;
  FT_Byte *cur_2;
  FT_Memory pFVar11;
  byte *pbVar12;
  FT_Fixed FVar13;
  FT_Pointer __dest;
  FT_Memory extraout_RAX;
  T1_FieldType TVar14;
  ulong uVar15;
  FT_Long power_ten;
  FT_Memory pFVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  byte *pbVar20;
  int iVar21;
  void **ppvVar22;
  uint max_values;
  FT_Memory pFVar23;
  ulong uVar24;
  FT_Error error;
  FT_Byte *cur;
  T1_TokenRec token2;
  T1_TokenRec token;
  FT_Error local_e0;
  int local_dc;
  byte *local_d8;
  long local_d0;
  void **local_c8;
  FT_Memory local_c0;
  ulong local_b8;
  ulong local_b0;
  T1_TokenType local_a4;
  FT_Memory local_a0;
  PS_Parser local_98;
  T1_Field local_90;
  ulong local_88;
  FT_Memory local_80;
  ulong local_78;
  ulong local_70;
  T1_TokenRec_ local_68;
  FT_Fixed local_50;
  T1_TokenRec_ local_48;
  
  uVar18 = (ulong)max_objects;
  local_98 = parser;
  ps_parser_to_token(parser,&local_48);
  pPVar8 = local_98;
  local_a4 = local_48.type;
  if (local_48.type == T1_TOKEN_TYPE_NONE) {
LAB_00231adb:
    local_e0 = 3;
  }
  else {
    local_d8 = local_48.start;
    TVar14 = field->type;
    pbVar20 = local_48.limit;
    local_c8 = objects;
    local_b8 = uVar18;
    local_90 = field;
    if (TVar14 == T1_FIELD_TYPE_BBOX) {
      pFVar3 = local_98->cursor;
      pFVar4 = local_98->limit;
      local_98->cursor = local_48.start + 1;
      local_98->limit = local_48.limit + -1;
      ps_parser_to_token(local_98,&local_68);
      pPVar8->cursor = pFVar3;
      pPVar8->limit = pFVar4;
      TVar14 = (local_68.type == T1_TOKEN_TYPE_ARRAY) + T1_FIELD_TYPE_BBOX;
      uVar18 = 1;
      if (local_68.type == T1_TOKEN_TYPE_ARRAY) {
LAB_0023152a:
        if ((int)local_b8 == 0) goto LAB_00231adb;
        local_d8 = local_48.start + 1;
        lVar19 = 1;
        pbVar20 = local_48.limit + -1;
      }
      else {
        lVar19 = 0;
      }
    }
    else {
      if (local_48.type == T1_TOKEN_TYPE_ARRAY) goto LAB_0023152a;
      uVar18 = 1;
      lVar19 = 0;
    }
    if ((int)uVar18 != 0) {
      iVar17 = (int)local_b8;
      local_88 = (ulong)(uint)(iVar17 * 4);
      local_70 = (ulong)(uint)(iVar17 * 2);
      local_78 = (ulong)(uint)(iVar17 * 3);
      pFVar11 = (FT_Memory)(local_b8 & 0xffffffff);
      uVar15 = (ulong)(TVar14 - T1_FIELD_TYPE_BOOL);
      ppvVar22 = local_c8;
      uVar24 = local_b8;
      local_b0 = uVar15;
      local_80 = pFVar11;
LAB_0023159f:
      pTVar9 = local_90;
      iVar17 = (int)uVar18;
      do {
        if ((pbVar20 <= local_d8) ||
           (pFVar11 = (FT_Memory)(ulong)*local_d8, (FT_Memory)0x25 < pFVar11)) goto LAB_002315dd;
        pbVar12 = local_d8;
        if ((0x100003601U >> ((ulong)pFVar11 & 0x3f) & 1) == 0) {
          if (pFVar11 != (FT_Memory)0x25) goto LAB_002315dd;
          do {
            bVar1 = *local_d8;
            pFVar11 = (FT_Memory)(ulong)bVar1;
            pbVar12 = local_d8;
            if ((bVar1 == 10) || (bVar1 == 0xd)) break;
            local_d8 = local_d8 + 1;
            pbVar12 = pbVar20;
          } while (local_d8 != pbVar20);
        }
        local_d8 = pbVar12 + 1;
      } while( true );
    }
LAB_00231ac3:
    local_e0 = 0;
  }
  return local_e0;
LAB_002315dd:
  pvVar5 = ppvVar22[lVar19];
  pFVar16 = (FT_Memory)(ulong)local_90->offset;
  if (7 < (uint)uVar15) {
    iVar21 = 2;
    goto LAB_00231a77;
  }
  switch((FT_Memory)
         ((long)&switchD_00231602::switchdataD_002fa390 +
         (long)(int)(&switchD_00231602::switchdataD_002fa390)[uVar15])) {
  case (FT_Memory)0x231604:
    iVar21 = 7;
    pFVar11 = (FT_Memory)
              ((long)&switchD_00231602::switchdataD_002fa390 +
              (long)(int)(&switchD_00231602::switchdataD_002fa390)[uVar15]);
    if (local_d8 < pbVar20) {
      pFVar23 = local_98->memory;
      iVar21 = (int)pbVar20 - (int)local_d8;
      pFVar11 = (FT_Memory)(ulong)local_a4;
      if (local_a4 == T1_TOKEN_TYPE_STRING) {
        uVar10 = iVar21 - 2;
      }
      else {
        if (local_a4 != T1_TOKEN_TYPE_KEY) {
          local_e0 = 3;
          iVar21 = 0x16;
          local_dc = iVar17;
          goto LAB_00231a61;
        }
        uVar10 = iVar21 - 1;
      }
      local_d8 = local_d8 + 1;
      local_dc = iVar17;
      local_d0 = lVar19;
      local_c0 = pFVar16;
      if (*(void **)((long)pvVar5 + (long)pFVar16) != (void *)0x0) {
        ft_mem_free(pFVar23,*(void **)((long)pvVar5 + (long)pFVar16));
        *(undefined8 *)((long)pvVar5 + (long)local_c0) = 0;
      }
      __dest = ft_mem_qalloc(pFVar23,(ulong)(uVar10 + 1),&local_e0);
      pFVar11 = local_c0;
      iVar21 = 0x16;
      uVar15 = local_b0;
      lVar19 = local_d0;
      iVar17 = local_dc;
      if (local_e0 == 0) {
        local_a0 = (FT_Memory)(ulong)uVar10;
        memcpy(__dest,local_d8,(size_t)local_a0);
        *(undefined1 *)((long)__dest + (long)local_a0) = 0;
        *(FT_Pointer *)((long)pvVar5 + (long)pFVar11) = __dest;
        iVar21 = 0;
        pFVar11 = local_a0;
        uVar15 = local_b0;
        lVar19 = local_d0;
        iVar17 = local_dc;
      }
    }
LAB_00231a61:
    ppvVar22 = local_c8;
    if ((iVar21 != 0) && (iVar21 != 7)) goto LAB_00231a77;
    goto LAB_00231a74;
  case (FT_Memory)0x23164f:
    power_ten = 0;
    goto LAB_002316bf;
  case (FT_Memory)0x231663:
    pFVar16 = local_98->memory;
    bVar7 = false;
    local_dc = iVar17;
    local_d0 = lVar19;
    pFVar11 = (FT_Memory)ft_mem_qrealloc(pFVar16,8,0,local_88,(void *)0x0,&local_e0);
    if (local_e0 == 0) {
      lVar19 = 0;
      local_c0 = pFVar11;
LAB_00231891:
      max_values = (uint)uVar24;
      uVar10 = ps_tofixedarray(&local_d8,pbVar20,max_values,
                               (FT_Fixed *)(&local_c0->user + (int)lVar19 * max_values),0);
      pFVar11 = local_c0;
      bVar7 = max_values <= uVar10 && -1 < (int)uVar10;
      if (max_values <= uVar10 && -1 < (int)uVar10) {
        do {
          if ((pbVar20 <= local_d8) || (uVar18 = (ulong)*local_d8, 0x25 < uVar18))
          goto LAB_00231907;
          pbVar12 = local_d8;
          if ((0x100003601U >> (uVar18 & 0x3f) & 1) == 0) {
            if (uVar18 != 0x25) goto LAB_00231907;
            do {
              pbVar12 = local_d8;
              if ((*local_d8 == 10) || (*local_d8 == 0xd)) break;
              local_d8 = local_d8 + 1;
              pbVar12 = pbVar20;
            } while (local_d8 != pbVar20);
          }
          local_d8 = pbVar12 + 1;
        } while( true );
      }
      local_e0 = 3;
      iVar21 = 0x16;
      goto LAB_00231a9c;
    }
    iVar21 = 0x16;
    goto LAB_00231aa9;
  case (FT_Memory)0x2316aa:
    power_ten = 3;
LAB_002316bf:
    local_d0 = lVar19;
    pFVar11 = (FT_Memory)PS_Conv_ToFixed(&local_d8,pbVar20,power_ten);
    ppvVar22 = local_c8;
    break;
  case (FT_Memory)0x2316cc:
    pbVar12 = local_d8 + 3;
    if ((((pbVar12 < pbVar20) && (*local_d8 == 0x74)) && (local_d8[1] == 0x72)) &&
       ((local_d8[2] == 0x75 && (*pbVar12 == 0x65)))) {
      local_d8 = local_d8 + 5;
      pFVar11 = (FT_Memory)&DAT_00000001;
      local_d0 = lVar19;
    }
    else {
      if ((((local_d8 + 4 < pbVar20) && ((*local_d8 == 0x66 && (local_d8[1] == 0x61)))) &&
          (local_d8[2] == 0x6c)) && ((*pbVar12 == 0x73 && (local_d8[4] == 0x65)))) {
        local_d8 = local_d8 + 6;
      }
      pFVar11 = (FT_Memory)0x0;
      local_d0 = lVar19;
    }
    break;
  case (FT_Memory)0x231712:
    local_d0 = lVar19;
    pFVar11 = (FT_Memory)PS_Conv_ToInt(&local_d8,pbVar20);
    ppvVar22 = local_c8;
    break;
  case (FT_Memory)0x231740:
    local_dc = iVar17;
    uVar10 = ps_tofixedarray(&local_d8,pbVar20,4,(FT_Fixed *)&local_68,0);
    if ((int)uVar10 < 4) {
      local_e0 = 3;
      iVar21 = 0x16;
    }
    else {
      local_c0 = (FT_Memory)CONCAT44(local_c0._4_4_,uVar10);
      FVar13 = FT_RoundFix((FT_Fixed)local_68.start);
      *(FT_Fixed *)((long)pvVar5 + (long)pFVar16) = FVar13;
      FVar13 = FT_RoundFix((FT_Fixed)local_68.limit);
      *(FT_Fixed *)((long)pvVar5 + (long)&pFVar16->alloc) = FVar13;
      FVar13 = FT_RoundFix(CONCAT44(local_68._20_4_,local_68.type));
      *(FT_Fixed *)((long)pvVar5 + (long)&pFVar16->free) = FVar13;
      FVar13 = FT_RoundFix(local_50);
      *(FT_Fixed *)((long)pvVar5 + (long)&pFVar16->realloc) = FVar13;
      iVar21 = 0;
      uVar10 = (uint)local_c0;
    }
    pFVar11 = (FT_Memory)(ulong)uVar10;
    uVar15 = local_b0;
    ppvVar22 = local_c8;
    iVar17 = local_dc;
    if ((int)uVar10 < 4) goto LAB_00231a77;
    goto LAB_00231a74;
  }
  FVar2 = pTVar9->size;
  uVar15 = local_b0;
  lVar19 = local_d0;
  uVar24 = local_b8;
  if (FVar2 == '\x04') {
    *(int *)((long)pvVar5 + (long)pFVar16) = (int)pFVar11;
  }
  else if (FVar2 == '\x02') {
    *(short *)((long)pvVar5 + (long)pFVar16) = (short)pFVar11;
  }
  else if (FVar2 == '\x01') {
    *(char *)((long)pvVar5 + (long)pFVar16) = (char)pFVar11;
  }
  else {
    *(FT_Memory *)((long)pvVar5 + (long)pFVar16) = pFVar11;
  }
LAB_00231a74:
  iVar21 = 0;
LAB_00231a77:
  if (iVar21 != 0) {
    if (iVar21 != 2) {
      if (iVar21 == 0x16) {
        return local_e0;
      }
      return (FT_Error)pFVar11;
    }
    goto LAB_00231adb;
  }
  lVar19 = lVar19 + 1;
  uVar18 = (ulong)(iVar17 - 1U);
  if (iVar17 - 1U == 0) goto LAB_00231ac3;
  goto LAB_0023159f;
LAB_00231907:
  lVar19 = lVar19 + 1;
  if (lVar19 == 4) goto code_r0x00231919;
  goto LAB_00231891;
code_r0x00231919:
  iVar21 = 0;
  if (max_values != 0) {
    pFVar23 = (FT_Memory)0x0;
    local_a0 = pFVar16;
    do {
      pFVar6 = (FT_Fixed *)local_c8[(long)pFVar23];
      FVar13 = FT_RoundFix((FT_Fixed)(&pFVar11->user)[(long)pFVar23]);
      pFVar16 = local_80;
      *pFVar6 = FVar13;
      iVar17 = (int)pFVar23;
      FVar13 = FT_RoundFix((FT_Fixed)(&pFVar11->user)[(uint)((int)local_80 + iVar17)]);
      pFVar6[1] = FVar13;
      FVar13 = FT_RoundFix((FT_Fixed)(&pFVar11->user)[(uint)((int)local_70 + iVar17)]);
      pFVar6[2] = FVar13;
      FVar13 = FT_RoundFix((FT_Fixed)(&pFVar11->user)[(uint)((int)local_78 + iVar17)]);
      pFVar6[3] = FVar13;
      pFVar23 = (FT_Memory)((long)&pFVar23->user + 1);
    } while (pFVar16 != pFVar23);
    iVar21 = 0;
    pFVar16 = local_a0;
    uVar24 = local_b8;
  }
LAB_00231a9c:
  ft_mem_free(pFVar16,local_c0);
  pFVar11 = extraout_RAX;
LAB_00231aa9:
  uVar15 = local_b0;
  lVar19 = local_d0;
  ppvVar22 = local_c8;
  iVar17 = local_dc;
  if (!bVar7) goto LAB_00231a77;
  goto LAB_00231a74;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_parser_load_field( PS_Parser       parser,
                        const T1_Field  field,
                        void**          objects,
                        FT_UInt         max_objects,
                        FT_ULong*       pflags )
  {
    T1_TokenRec   token;
    FT_Byte*      cur;
    FT_Byte*      limit;
    FT_UInt       count;
    FT_UInt       idx;
    FT_Error      error;
    T1_FieldType  type;


    /* this also skips leading whitespace */
    ps_parser_to_token( parser, &token );
    if ( !token.type )
      goto Fail;

    count = 1;
    idx   = 0;
    cur   = token.start;
    limit = token.limit;

    type = field->type;

    /* we must detect arrays in /FontBBox */
    if ( type == T1_FIELD_TYPE_BBOX )
    {
      T1_TokenRec  token2;
      FT_Byte*     old_cur   = parser->cursor;
      FT_Byte*     old_limit = parser->limit;


      /* don't include delimiters */
      parser->cursor = token.start + 1;
      parser->limit  = token.limit - 1;

      ps_parser_to_token( parser, &token2 );
      parser->cursor = old_cur;
      parser->limit  = old_limit;

      if ( token2.type == T1_TOKEN_TYPE_ARRAY )
      {
        type = T1_FIELD_TYPE_MM_BBOX;
        goto FieldArray;
      }
    }
    else if ( token.type == T1_TOKEN_TYPE_ARRAY )
    {
      count = max_objects;

    FieldArray:
      /* if this is an array and we have no blend, an error occurs */
      if ( max_objects == 0 )
        goto Fail;

      idx = 1;

      /* don't include delimiters */
      cur++;
      limit--;
    }

    for ( ; count > 0; count--, idx++ )
    {
      FT_Byte*    q      = (FT_Byte*)objects[idx] + field->offset;
      FT_Long     val;


      skip_spaces( &cur, limit );

      switch ( type )
      {
      case T1_FIELD_TYPE_BOOL:
        val = ps_tobool( &cur, limit );
        FT_TRACE4(( " %s", val ? "true" : "false" ));
        goto Store_Integer;

      case T1_FIELD_TYPE_FIXED:
        val = PS_Conv_ToFixed( &cur, limit, 0 );
        FT_TRACE4(( " %f", (double)val / 65536 ));
        goto Store_Integer;

      case T1_FIELD_TYPE_FIXED_1000:
        val = PS_Conv_ToFixed( &cur, limit, 3 );
        FT_TRACE4(( " %f", (double)val / 65536 / 1000 ));
        goto Store_Integer;

      case T1_FIELD_TYPE_INTEGER:
        val = PS_Conv_ToInt( &cur, limit );
        FT_TRACE4(( " %ld", val ));
        /* fall through */

      Store_Integer:
        switch ( field->size )
        {
        case (8 / FT_CHAR_BIT):
          *(FT_Byte*)q = (FT_Byte)val;
          break;

        case (16 / FT_CHAR_BIT):
          *(FT_UShort*)q = (FT_UShort)val;
          break;

        case (32 / FT_CHAR_BIT):
          *(FT_UInt32*)q = (FT_UInt32)val;
          break;

        default:                /* for 64-bit systems */
          *(FT_Long*)q = val;
        }
        break;

      case T1_FIELD_TYPE_STRING:
      case T1_FIELD_TYPE_KEY:
        {
          FT_Memory   memory = parser->memory;
          FT_UInt     len    = (FT_UInt)( limit - cur );
          FT_String*  string = NULL;


          if ( cur >= limit )
            break;

          /* we allow both a string or a name   */
          /* for cases like /FontName (foo) def */
          if ( token.type == T1_TOKEN_TYPE_KEY )
          {
            /* don't include leading `/' */
            len--;
            cur++;
          }
          else if ( token.type == T1_TOKEN_TYPE_STRING )
          {
            /* don't include delimiting parentheses    */
            /* XXX we don't handle <<...>> here        */
            /* XXX should we convert octal escapes?    */
            /*     if so, what encoding should we use? */
            cur++;
            len -= 2;
          }
          else
          {
            FT_ERROR(( "ps_parser_load_field:"
                       " expected a name or string\n" ));
            FT_ERROR(( "                     "
                       " but found token of type %d instead\n",
                       token.type ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }

          /* for this to work (FT_String**)q must have been */
          /* initialized to NULL                            */
          if ( *(FT_String**)q )
          {
            FT_TRACE0(( "ps_parser_load_field: overwriting field %s\n",
                        field->ident ));
            FT_FREE( *(FT_String**)q );
          }

          if ( FT_QALLOC( string, len + 1 ) )
            goto Exit;

          FT_MEM_COPY( string, cur, len );
          string[len] = 0;

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( token.type == T1_TOKEN_TYPE_STRING )
            FT_TRACE4(( " (%s)", string ));
          else
            FT_TRACE4(( " /%s", string ));
#endif

          *(FT_String**)q = string;
        }
        break;

      case T1_FIELD_TYPE_BBOX:
        {
          FT_Fixed  temp[4];
          FT_BBox*  bbox = (FT_BBox*)q;
          FT_Int    result;


          result = ps_tofixedarray( &cur, limit, 4, temp, 0 );

          if ( result < 4 )
          {
            FT_ERROR(( "ps_parser_load_field:"
                       " expected four integers in bounding box\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }

          bbox->xMin = FT_RoundFix( temp[0] );
          bbox->yMin = FT_RoundFix( temp[1] );
          bbox->xMax = FT_RoundFix( temp[2] );
          bbox->yMax = FT_RoundFix( temp[3] );

          FT_TRACE4(( " [%ld %ld %ld %ld]",
                      bbox->xMin / 65536,
                      bbox->yMin / 65536,
                      bbox->xMax / 65536,
                      bbox->yMax / 65536 ));
        }
        break;

      case T1_FIELD_TYPE_MM_BBOX:
        {
          FT_Memory  memory = parser->memory;
          FT_Fixed*  temp   = NULL;
          FT_Int     result;
          FT_UInt    i;


          if ( FT_QNEW_ARRAY( temp, max_objects * 4 ) )
            goto Exit;

          for ( i = 0; i < 4; i++ )
          {
            result = ps_tofixedarray( &cur, limit, (FT_Int)max_objects,
                                      temp + i * max_objects, 0 );
            if ( result < 0 || (FT_UInt)result < max_objects )
            {
              FT_ERROR(( "ps_parser_load_field:"
                         " expected %d integer%s in the %s subarray\n",
                         max_objects, max_objects > 1 ? "s" : "",
                         i == 0 ? "first"
                                : ( i == 1 ? "second"
                                           : ( i == 2 ? "third"
                                                      : "fourth" ) ) ));
              FT_ERROR(( "                     "
                         " of /FontBBox in the /Blend dictionary\n" ));
              error = FT_THROW( Invalid_File_Format );

              FT_FREE( temp );
              goto Exit;
            }

            skip_spaces( &cur, limit );
          }

          FT_TRACE4(( " [" ));
          for ( i = 0; i < max_objects; i++ )
          {
            FT_BBox*  bbox = (FT_BBox*)objects[i];


            bbox->xMin = FT_RoundFix( temp[i                  ] );
            bbox->yMin = FT_RoundFix( temp[i +     max_objects] );
            bbox->xMax = FT_RoundFix( temp[i + 2 * max_objects] );
            bbox->yMax = FT_RoundFix( temp[i + 3 * max_objects] );

            FT_TRACE4(( " [%ld %ld %ld %ld]",
                        bbox->xMin / 65536,
                        bbox->yMin / 65536,
                        bbox->xMax / 65536,
                        bbox->yMax / 65536 ));
          }
          FT_TRACE4(( "]" ));

          FT_FREE( temp );
        }
        break;

      default:
        /* an error occurred */
        goto Fail;
      }
    }

#if 0  /* obsolete -- keep for reference */
    if ( pflags )
      *pflags |= 1L << field->flag_bit;
#else
    FT_UNUSED( pflags );
#endif

    error = FT_Err_Ok;

  Exit:
    return error;

  Fail:
    error = FT_THROW( Invalid_File_Format );
    goto Exit;
  }